

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MADPComponentDiscreteActions.cpp
# Opt level: O2

void __thiscall
MADPComponentDiscreteActions::SetNrActions(MADPComponentDiscreteActions *this,Index AI,size_t nrA)

{
  ostream *poVar1;
  E *this_00;
  uint i;
  allocator<char> local_279;
  size_t nrA_local;
  MADPComponentDiscreteActions *local_270;
  vector<ActionDiscrete,_std::allocator<ActionDiscrete>_> thisAgentsActions;
  string local_250;
  string local_230;
  ActionDiscrete local_210;
  stringstream ss;
  ostream local_1a8 [376];
  
  nrA_local = nrA;
  if ((long)(this->_m_nrActions).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
            _M_impl.super__Vector_impl_data._M_finish -
      (long)(this->_m_nrActions).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
            _M_impl.super__Vector_impl_data._M_start >> 3 == (ulong)AI) {
    local_270 = this;
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
              (&this->_m_nrActions,&nrA_local);
    thisAgentsActions.super__Vector_base<ActionDiscrete,_std::allocator<ActionDiscrete>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    thisAgentsActions.super__Vector_base<ActionDiscrete,_std::allocator<ActionDiscrete>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    thisAgentsActions.super__Vector_base<ActionDiscrete,_std::allocator<ActionDiscrete>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    for (i = 0; i < nrA_local; i = i + 1) {
      std::__cxx11::stringstream::stringstream((stringstream *)&ss);
      poVar1 = std::operator<<(local_1a8,"a");
      std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
      std::__cxx11::stringbuf::str();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_250,"undefined",&local_279);
      ActionDiscrete::ActionDiscrete(&local_210,i,&local_230,&local_250);
      std::vector<ActionDiscrete,_std::allocator<ActionDiscrete>_>::emplace_back<ActionDiscrete>
                (&thisAgentsActions,&local_210);
      NamedDescribedEntity::~NamedDescribedEntity((NamedDescribedEntity *)&local_210);
      std::__cxx11::string::~string((string *)&local_250);
      std::__cxx11::string::~string((string *)&local_230);
      std::__cxx11::stringstream::~stringstream((stringstream *)&ss);
    }
    std::
    vector<std::vector<ActionDiscrete,_std::allocator<ActionDiscrete>_>,_std::allocator<std::vector<ActionDiscrete,_std::allocator<ActionDiscrete>_>_>_>
    ::push_back(&local_270->_m_actionVecs,&thisAgentsActions);
    std::vector<ActionDiscrete,_std::allocator<ActionDiscrete>_>::~vector(&thisAgentsActions);
    return;
  }
  std::__cxx11::stringstream::stringstream((stringstream *)&ss);
  poVar1 = std::operator<<(local_1a8,"MADPComponentDiscreteActions::SetNrAction(");
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  poVar1 = std::operator<<(poVar1,",");
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  poVar1 = std::operator<<(poVar1,") - error, actions of agents should be specified in order!");
  poVar1 = std::operator<<(poVar1," (the vector _m_nrActions should contain entries for all ");
  std::operator<<(poVar1,"preceeding agents.)");
  this_00 = (E *)__cxa_allocate_exception(0x28);
  E::E(this_00,&ss);
  __cxa_throw(this_00,&E::typeinfo,E::~E);
}

Assistant:

void MADPComponentDiscreteActions::SetNrActions(Index AI, size_t nrA)
{
    if(_m_nrActions.size() != AI)
    {
        stringstream ss;
        ss << "MADPComponentDiscreteActions::SetNrAction("<<AI<<","<<
            nrA<<
            ") - error, actions of agents should be specified in order!"<<
            " (the vector _m_nrActions should contain entries for all "<<
            "preceeding agents.)";
        throw(E(ss));
    }
    else
    {
        _m_nrActions.push_back(nrA);
        //create nameless actions for this agent...    
        vector<ActionDiscrete> thisAgentsActions;
        for(Index i=0;i<nrA;i++)
        {
            stringstream ss;
            ss //<< "ag"<<AI
                <<"a"<<i;
            thisAgentsActions.push_back(ActionDiscrete(i, ss.str() ));
        }
        _m_actionVecs.push_back(thisAgentsActions);
    }
}